

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resDivs.c
# Opt level: O3

int Res_NodeRef_rec(Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  int iVar5;
  long lVar6;
  
  uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
  iVar5 = 0;
  if ((uVar2 != 2) && (iVar5 = 0, uVar2 != 5)) {
    iVar3 = (pNode->vFanins).nSize;
    if (iVar3 < 1) {
      iVar5 = 1;
    }
    else {
      pAVar4 = pNode->pNtk;
      iVar5 = 1;
      lVar6 = 0;
      do {
        pNode_00 = (Abc_Obj_t *)pAVar4->vObjs->pArray[(pNode->vFanins).pArray[lVar6]];
        iVar1 = (pNode_00->vFanouts).nSize;
        (pNode_00->vFanouts).nSize = iVar1 + 1;
        if (iVar1 == 0) {
          iVar3 = Res_NodeRef_rec(pNode_00);
          iVar5 = iVar5 + iVar3;
          pAVar4 = pNode->pNtk;
          iVar3 = (pNode->vFanins).nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar3);
    }
  }
  return iVar5;
}

Assistant:

int Res_NodeRef_rec( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i, Counter = 1;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( pFanin->vFanouts.nSize++ == 0 )
            Counter += Res_NodeRef_rec( pFanin );
    }
    return Counter;
}